

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data_common.c
# Opt level: O2

lys_module * lyd_data_next_module(lyd_node **next,lyd_node **first)

{
  lys_module *plVar1;
  lys_module *plVar2;
  lyd_node *node;
  
  if (*next == (lyd_node *)0x0) {
    *first = (lyd_node *)0x0;
    plVar1 = (lys_module *)0x0;
  }
  else {
    *first = *next;
    plVar1 = lyd_owner_module(*next);
    node = *next;
    while (node != (lyd_node *)0x0) {
      plVar2 = lyd_owner_module(node);
      if (plVar2 != plVar1) {
        return plVar1;
      }
      node = (*next)->next;
      *next = node;
    }
  }
  return plVar1;
}

Assistant:

const struct lys_module *
lyd_data_next_module(struct lyd_node **next, struct lyd_node **first)
{
    const struct lys_module *mod;

    if (!*next) {
        /* all data traversed */
        *first = NULL;
        return NULL;
    }

    *first = *next;

    /* prepare next */
    mod = lyd_owner_module(*next);
    LY_LIST_FOR(*next, *next) {
        if (lyd_owner_module(*next) != mod) {
            break;
        }
    }

    return mod;
}